

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cradix-improved.c
# Opt level: O2

void RDFK(LPPSTR *GrpKP,LPPSTR a,UINT n,LPPSTR ta,UINT *count,UINT d)

{
  int *piVar1;
  ulong *puVar2;
  ulong uVar3;
  UINT UVar4;
  ulong *puVar5;
  LPPSTR ppuVar6;
  long lVar7;
  uchar cache [32];
  byte local_58 [40];
  
  ppuVar6 = a;
  for (uVar3 = 0; uVar3 < (n & 0xffffffffffffffe0); uVar3 = uVar3 + 0x20) {
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
      local_58[lVar7] = ppuVar6[lVar7][d];
    }
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
      count[local_58[lVar7]] = count[local_58[lVar7]] + 1;
    }
    ppuVar6 = ppuVar6 + 0x20;
  }
  for (; puVar2 = count, uVar3 < n; uVar3 = uVar3 + 1) {
    count[a[uVar3][d]] = count[a[uVar3][d]] + 1;
  }
  do {
    puVar5 = puVar2;
    puVar2 = puVar5 + 1;
  } while (*puVar5 == 0);
  if (*puVar5 < n) {
    *GrpKP = a;
    ppuVar6 = a;
    for (lVar7 = 0; lVar7 != 0xff; lVar7 = lVar7 + 1) {
      ppuVar6 = ppuVar6 + count[lVar7];
      GrpKP[lVar7 + 1] = ppuVar6;
    }
    memcpy(ta,a,n * 8);
    for (UVar4 = 0; n != UVar4; UVar4 = UVar4 + 1) {
      *GrpKP[ta[UVar4][d]] = ta[UVar4];
      GrpKP[ta[UVar4][d]] = GrpKP[ta[UVar4][d]] + 1;
    }
    lVar7 = 0;
    do {
      if (lVar7 != 0) {
        if (lVar7 == 0xff) {
          return;
        }
        uVar3 = count[lVar7];
        if (uVar3 < 0x15) {
          if (1 < uVar3) {
            insertion_sort(a,(int)uVar3,d);
          }
        }
        else {
          _sp->sa = a;
          _sp->sk = (LPBYTE)0x0;
          _sp->sn = (int)uVar3;
          piVar1 = &_sp->sb;
          _sp = _sp + 1;
          *piVar1 = (int)d + 1;
        }
      }
      a = a + count[lVar7];
      count[lVar7] = 0;
      lVar7 = lVar7 + 1;
    } while( true );
  }
  if (((long)puVar5 - (long)count & 0x7f8U) == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)((long)puVar5 - (long)count) >> 3 & 0xff;
    if (count[uVar3] < 0x15) {
      if (1 < n) {
        insertion_sort(a,(int)n,d);
      }
    }
    else {
      _sp->sa = a;
      _sp->sk = (LPBYTE)0x0;
      _sp->sn = (int)n;
      piVar1 = &_sp->sb;
      _sp = _sp + 1;
      *piVar1 = (int)d + 1;
    }
  }
  count[uVar3] = 0;
  return;
}

Assistant:

static
void RDFK(LPPSTR* GrpKP, LPPSTR a, UINT n, LPPSTR ta,
		UINT* count, UINT d)
{ /* Read Directly From Keys */
	LPPSTR ak, tc; UINT i, *cptr, gs; unsigned char c=0;
	for (i=0; i<n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j<32; ++j) cache[j] = a[i+j][d];
		for (unsigned j=0; j<32; ++j) ++count[cache[j]];
	}
	for (; i<n; i++) count[a[i][d]]++;
	cptr=&count[AL]; while (*cptr<1) cptr++;
	if (*cptr<n) gs=n;
	else { c=(cptr-&count[AL])+AL; gs=0; }
	if (!gs) {
		if (splittable(c)) push(a, 0, n, d+1);
		else if (n>1 && c>0) insertion_sort(a, n, d);
		count[c]=0; return;
	}
	GrpKP[AL]=a;
	for (ak=a, i=AL; i<AH; i++) GrpKP[i+1]=ak+=count[i];
	memcpy(ta, a, sizeof(LPSTR)*n);
	for (i=0, tc=ta; i<n; i++, tc++) {
		*GrpKP[ta[i][d]]=*tc; GrpKP[ta[i][d]]++;
	}
	for (ak=a, i=AL; i<AH; i++) {
		if (splittable(i)) push(ak, 0, count[i], d+1);
		else if (count[i]>1 && i>0) insertion_sort(ak, count[i], d);
		ak+=count[i]; count[i]=0;
	}
}